

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
::dump(key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
       *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  
  bVar1 = length(this);
  poVar2 = std::operator<<(os,", prefix(");
  poVar2 = std::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,")");
  if (bVar1 != 0) {
    std::operator<<(os,": 0x");
    for (uVar3 = 0; bVar1 != uVar3; uVar3 = uVar3 + 1) {
      dump_byte(os,(byte)this[uVar3]);
    }
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
    const auto len = length();
    os << ", prefix(" << len << ")";
    if (len > 0) {
      os << ": 0x";
      for (std::size_t i = 0; i < len; ++i) dump_byte(os, f.key_prefix[i]);
    }
  }